

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

bool isCompressedFormat(TextureFormat internalFormat)

{
  bool bVar1;
  GLsizei GVar2;
  byte bVar3;
  uint uVar4;
  GLenum GVar5;
  int zoffset;
  GLenum target;
  GLsizei GVar6;
  GLint in_ESI;
  GLuint GVar7;
  undefined4 in_register_0000003c;
  undefined8 *puVar8;
  QOpenGLTextureHelper *pQVar9;
  GLenum in_R8D;
  GLint GVar10;
  GLenum in_R9D;
  GLsizei height;
  int iVar11;
  long in_FS_OFFSET;
  GLenum in_stack_00000008;
  GLvoid *in_stack_00000010;
  QOpenGLPixelTransferOptions *in_stack_00000018;
  GLint yoffset;
  char acStack_58 [24];
  char *pcStack_40;
  long lStack_38;
  
  puVar8 = (undefined8 *)CONCAT44(in_register_0000003c,internalFormat);
  if ((0x2d < internalFormat - RGBA_ASTC_4x4) ||
     ((0x3fff00003fffU >> ((ulong)(internalFormat - RGBA_ASTC_4x4) & 0x3f) & 1) == 0)) {
    bVar1 = false;
    if (internalFormat - R8_UNorm < 0x14) {
      return false;
    }
    uVar4 = internalFormat - S8;
    if (uVar4 < 0x3c) {
      if ((0xc30c30004000001U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
        return false;
      }
      if ((ulong)uVar4 == 0x1c) goto switchD_0015105c_caseD_8c41;
    }
    if (9 < internalFormat - R11_EAC_UNorm) {
      uVar4 = internalFormat - RGBA16I;
      if (uVar4 < 0x37) {
        if ((0xc3UL >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
          return false;
        }
        if ((0x78000000000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto switchD_0015105c_caseD_8c41;
      }
      if (internalFormat - R8_SNorm < 8) {
        return false;
      }
      if ((internalFormat - DepthFormat < 9) &&
         ((0x1f1U >> (internalFormat - DepthFormat & 0x1f) & 1) != 0)) {
        return false;
      }
      if ((internalFormat - RGB8_UNorm < 0xb) &&
         ((0x4e9U >> (internalFormat - RGB8_UNorm & 0x1f) & 1) != 0)) {
        return false;
      }
      if (3 < internalFormat - RGB_DXT1) {
        if ((internalFormat - RGBA32F < 8) &&
           ((0xc3U >> (internalFormat - RGBA32F & 0x1f) & 1) != 0)) {
          return false;
        }
        if (internalFormat - RG11B10F < 10) {
          GVar2 = (&switchD_0015105c::switchdataD_00179550)[internalFormat - RG11B10F] + 0x179550;
          switch(internalFormat) {
          case RG11B10F:
          case RGB9E5:
            goto switchD_0015105c_caseD_8c3a;
          default:
            lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
            iVar11 = *(int *)(puVar8 + 2);
            bVar3 = (byte)in_ESI;
            if (iVar11 == 0xde0) {
              iVar11 = *(int *)((long)puVar8 + 0x24) >> (bVar3 & 0x1f);
              GVar2 = 1;
              if (1 < iVar11) {
                GVar2 = iVar11;
              }
              QOpenGLTextureHelper::glTextureSubImage1D
                        ((QOpenGLTextureHelper *)puVar8[0x16],*(GLuint *)(puVar8 + 3),0xde0,
                         *(GLenum *)((long)puVar8 + 0x14),in_ESI,0,GVar2,in_R9D,in_stack_00000008,
                         in_stack_00000010,in_stack_00000018);
              goto LAB_0015143b;
            }
            GVar10 = in_ESI;
            if (iVar11 == 0xde1) {
              pQVar9 = (QOpenGLTextureHelper *)puVar8[0x16];
              GVar5 = *(GLenum *)((long)puVar8 + 0x14);
              GVar6 = *(int *)((long)puVar8 + 0x24) >> (bVar3 & 0x1f);
              if (GVar6 < 2) {
                GVar6 = 1;
              }
              GVar2 = *(int *)(puVar8 + 5) >> (bVar3 & 0x1f);
              GVar7 = *(GLuint *)(puVar8 + 3);
              if (GVar2 < 2) {
                GVar2 = 1;
              }
              in_R8D = 0xde1;
LAB_0015142e:
              yoffset = 0;
            }
            else {
              if (iVar11 == 0x806f) {
                pQVar9 = (QOpenGLTextureHelper *)puVar8[0x16];
                GVar5 = *(GLenum *)((long)puVar8 + 0x14);
                iVar11 = *(int *)((long)puVar8 + 0x24) >> (bVar3 & 0x1f);
                GVar6 = 1;
                if (iVar11 < 2) {
                  iVar11 = GVar6;
                }
                height = *(int *)(puVar8 + 5) >> (bVar3 & 0x1f);
                if (height < 2) {
                  height = GVar6;
                }
                GVar2 = *(int *)((long)puVar8 + 0x2c) >> (bVar3 & 0x1f);
                GVar7 = *(GLuint *)(puVar8 + 3);
                if (GVar2 < 2) {
                  GVar2 = GVar6;
                }
                zoffset = 0x179550;
                target = 0x806f;
LAB_00151381:
                QOpenGLTextureHelper::glTextureSubImage3D
                          (pQVar9,GVar7,target,GVar5,in_ESI,0,0,zoffset,iVar11,height,GVar2,in_R9D,
                           in_stack_00000008,in_stack_00000010,in_stack_00000018);
                goto LAB_0015143b;
              }
              if (iVar11 == 0x84f5) {
                pQVar9 = (QOpenGLTextureHelper *)puVar8[0x16];
                GVar5 = *(GLenum *)((long)puVar8 + 0x14);
                GVar7 = *(GLuint *)(puVar8 + 3);
                GVar6 = *(GLsizei *)((long)puVar8 + 0x24);
                GVar2 = *(GLsizei *)(puVar8 + 5);
                yoffset = 0;
                in_R8D = 0x84f5;
                GVar10 = 0;
              }
              else {
                if (iVar11 == 0x8513) {
                  pQVar9 = (QOpenGLTextureHelper *)puVar8[0x16];
                  GVar5 = *(GLenum *)((long)puVar8 + 0x14);
                  GVar6 = *(int *)((long)puVar8 + 0x24) >> (bVar3 & 0x1f);
                  if (GVar6 < 2) {
                    GVar6 = 1;
                  }
                  GVar2 = *(int *)(puVar8 + 5) >> (bVar3 & 0x1f);
                  GVar7 = *(GLuint *)(puVar8 + 3);
                  if (GVar2 < 2) {
                    GVar2 = 1;
                  }
                  goto LAB_0015142e;
                }
                if (iVar11 != 0x8c18) {
                  if (iVar11 == 0x8c1a) {
                    pQVar9 = (QOpenGLTextureHelper *)puVar8[0x16];
                    GVar5 = *(GLenum *)((long)puVar8 + 0x14);
                    iVar11 = *(int *)((long)puVar8 + 0x24) >> (bVar3 & 0x1f);
                    if (iVar11 < 2) {
                      iVar11 = 1;
                    }
                    height = *(int *)(puVar8 + 5) >> (bVar3 & 0x1f);
                    GVar7 = *(GLuint *)(puVar8 + 3);
                    if (height < 2) {
                      height = 1;
                    }
                    zoffset = 0x179550;
                    target = 0x8c1a;
                  }
                  else {
                    if (iVar11 != 0x9009) {
                      if (((iVar11 == 0x8c2a) || (iVar11 == 0x9100)) || (iVar11 == 0x9102)) {
                        acStack_58[0] = '\x02';
                        acStack_58[1] = '\0';
                        acStack_58[2] = '\0';
                        acStack_58[3] = '\0';
                        acStack_58[0x14] = '\0';
                        acStack_58[0x15] = '\0';
                        acStack_58[0x16] = '\0';
                        acStack_58[0x17] = '\0';
                        acStack_58[4] = '\0';
                        acStack_58[5] = '\0';
                        acStack_58[6] = '\0';
                        acStack_58[7] = '\0';
                        acStack_58[8] = '\0';
                        acStack_58[9] = '\0';
                        acStack_58[10] = '\0';
                        acStack_58[0xb] = '\0';
                        acStack_58[0xc] = '\0';
                        acStack_58[0xd] = '\0';
                        acStack_58[0xe] = '\0';
                        acStack_58[0xf] = '\0';
                        acStack_58[0x10] = '\0';
                        acStack_58[0x11] = '\0';
                        acStack_58[0x12] = '\0';
                        acStack_58[0x13] = '\0';
                        pcStack_40 = "default";
                        QMessageLogger::warning
                                  (acStack_58,
                                   "QOpenGLTexture::setData(): Texture target does not support pixel data upload"
                                  );
                      }
                      goto LAB_0015143b;
                    }
                    zoffset = in_R8D + 0x8cfacb;
                    pQVar9 = (QOpenGLTextureHelper *)puVar8[0x16];
                    GVar5 = *(GLenum *)((long)puVar8 + 0x14);
                    iVar11 = *(int *)((long)puVar8 + 0x24) >> (bVar3 & 0x1f);
                    if (iVar11 < 2) {
                      iVar11 = 1;
                    }
                    height = *(int *)(puVar8 + 5) >> (bVar3 & 0x1f);
                    GVar7 = *(GLuint *)(puVar8 + 3);
                    if (height < 2) {
                      height = 1;
                    }
                    target = 0x9009;
                  }
                  goto LAB_00151381;
                }
                pQVar9 = (QOpenGLTextureHelper *)puVar8[0x16];
                GVar5 = *(GLenum *)((long)puVar8 + 0x14);
                GVar7 = *(GLuint *)(puVar8 + 3);
                iVar11 = *(int *)((long)puVar8 + 0x24) >> (bVar3 & 0x1f);
                GVar6 = 1;
                if (1 < iVar11) {
                  GVar6 = iVar11;
                }
                yoffset = 0x179550;
                in_R8D = 0x8c18;
              }
            }
            QOpenGLTextureHelper::glTextureSubImage2D
                      (pQVar9,GVar7,in_R8D,GVar5,GVar10,0,yoffset,GVar6,GVar2,in_R9D,
                       in_stack_00000008,in_stack_00000010,in_stack_00000018);
LAB_0015143b:
            if (((in_ESI == 0) && (*(char *)((long)puVar8 + 0xad) == '\x01')) &&
               (1 < *(int *)((long)puVar8 + 0x34))) {
              QOpenGLTexture::generateMipMaps((QOpenGLTexture *)*puVar8);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
              return SUB81(*(long *)(in_FS_OFFSET + 0x28),0);
            }
            __stack_chk_fail();
          case SRGB8:
          case SRGB8_Alpha8:
            goto switchD_0015105c_caseD_8c41;
          }
        }
        if ((3 < internalFormat - SRGB_DXT1) && (3 < internalFormat - RGB_BP_UNorm)) {
          if (internalFormat - D16 < 3) {
            return false;
          }
          if (internalFormat - D32F < 2) {
            return false;
          }
          if (internalFormat == NoFormat) {
            return false;
          }
          if (internalFormat == RG3B2) {
            return false;
          }
          return bVar1;
        }
      }
    }
  }
switchD_0015105c_caseD_8c41:
  bVar1 = true;
switchD_0015105c_caseD_8c3a:
  return bVar1;
}

Assistant:

static bool isCompressedFormat(QOpenGLTexture::TextureFormat internalFormat)
{
    switch (internalFormat) {
    case QOpenGLTexture::NoFormat:

    case QOpenGLTexture::R8_UNorm:
    case QOpenGLTexture::RG8_UNorm:
    case QOpenGLTexture::RGB8_UNorm:
    case QOpenGLTexture::RGBA8_UNorm:
    case QOpenGLTexture::R16_UNorm:
    case QOpenGLTexture::RG16_UNorm:
    case QOpenGLTexture::RGB16_UNorm:
    case QOpenGLTexture::RGBA16_UNorm:
    case QOpenGLTexture::R8_SNorm:
    case QOpenGLTexture::RG8_SNorm:
    case QOpenGLTexture::RGB8_SNorm:
    case QOpenGLTexture::RGBA8_SNorm:
    case QOpenGLTexture::R16_SNorm:
    case QOpenGLTexture::RG16_SNorm:
    case QOpenGLTexture::RGB16_SNorm:
    case QOpenGLTexture::RGBA16_SNorm:
    case QOpenGLTexture::R8U:
    case QOpenGLTexture::RG8U:
    case QOpenGLTexture::RGB8U:
    case QOpenGLTexture::RGBA8U:
    case QOpenGLTexture::R16U:
    case QOpenGLTexture::RG16U:
    case QOpenGLTexture::RGB16U:
    case QOpenGLTexture::RGBA16U:
    case QOpenGLTexture::R32U:
    case QOpenGLTexture::RG32U:
    case QOpenGLTexture::RGB32U:
    case QOpenGLTexture::RGBA32U:
    case QOpenGLTexture::R8I:
    case QOpenGLTexture::RG8I:
    case QOpenGLTexture::RGB8I:
    case QOpenGLTexture::RGBA8I:
    case QOpenGLTexture::R16I:
    case QOpenGLTexture::RG16I:
    case QOpenGLTexture::RGB16I:
    case QOpenGLTexture::RGBA16I:
    case QOpenGLTexture::R32I:
    case QOpenGLTexture::RG32I:
    case QOpenGLTexture::RGB32I:
    case QOpenGLTexture::RGBA32I:
    case QOpenGLTexture::R16F:
    case QOpenGLTexture::RG16F:
    case QOpenGLTexture::RGB16F:
    case QOpenGLTexture::RGBA16F:
    case QOpenGLTexture::R32F:
    case QOpenGLTexture::RG32F:
    case QOpenGLTexture::RGB32F:
    case QOpenGLTexture::RGBA32F:
    case QOpenGLTexture::RGB9E5:
    case QOpenGLTexture::RG11B10F:
    case QOpenGLTexture::RG3B2:
    case QOpenGLTexture::R5G6B5:
    case QOpenGLTexture::RGB5A1:
    case QOpenGLTexture::RGBA4:
    case QOpenGLTexture::RGB10A2:

    case QOpenGLTexture::D16:
    case QOpenGLTexture::D24:
    case QOpenGLTexture::D32:
    case QOpenGLTexture::D32F:

    case QOpenGLTexture::D24S8:
    case QOpenGLTexture::D32FS8X24:

    case QOpenGLTexture::S8:
        return false;

    case QOpenGLTexture::RGB_DXT1:
    case QOpenGLTexture::RGBA_DXT1:
    case QOpenGLTexture::RGBA_DXT3:
    case QOpenGLTexture::RGBA_DXT5:
    case QOpenGLTexture::R_ATI1N_UNorm:
    case QOpenGLTexture::R_ATI1N_SNorm:
    case QOpenGLTexture::RG_ATI2N_UNorm:
    case QOpenGLTexture::RG_ATI2N_SNorm:
    case QOpenGLTexture::RGB_BP_UNSIGNED_FLOAT:
    case QOpenGLTexture::RGB_BP_SIGNED_FLOAT:
    case QOpenGLTexture::RGB_BP_UNorm:
    case QOpenGLTexture::SRGB8:
    case QOpenGLTexture::SRGB8_Alpha8:
    case QOpenGLTexture::SRGB_DXT1:
    case QOpenGLTexture::SRGB_Alpha_DXT1:
    case QOpenGLTexture::SRGB_Alpha_DXT3:
    case QOpenGLTexture::SRGB_Alpha_DXT5:
    case QOpenGLTexture::SRGB_BP_UNorm:
    case QOpenGLTexture::R11_EAC_UNorm:
    case QOpenGLTexture::R11_EAC_SNorm:
    case QOpenGLTexture::RG11_EAC_UNorm:
    case QOpenGLTexture::RG11_EAC_SNorm:
    case QOpenGLTexture::RGB8_ETC2:
    case QOpenGLTexture::SRGB8_ETC2:
    case QOpenGLTexture::RGB8_PunchThrough_Alpha1_ETC2:
    case QOpenGLTexture::SRGB8_PunchThrough_Alpha1_ETC2:
    case QOpenGLTexture::RGBA8_ETC2_EAC:
    case QOpenGLTexture::SRGB8_Alpha8_ETC2_EAC:
    case QOpenGLTexture::RGB8_ETC1:
    case QOpenGLTexture::RGBA_ASTC_4x4:
    case QOpenGLTexture::RGBA_ASTC_5x4:
    case QOpenGLTexture::RGBA_ASTC_5x5:
    case QOpenGLTexture::RGBA_ASTC_6x5:
    case QOpenGLTexture::RGBA_ASTC_6x6:
    case QOpenGLTexture::RGBA_ASTC_8x5:
    case QOpenGLTexture::RGBA_ASTC_8x6:
    case QOpenGLTexture::RGBA_ASTC_8x8:
    case QOpenGLTexture::RGBA_ASTC_10x5:
    case QOpenGLTexture::RGBA_ASTC_10x6:
    case QOpenGLTexture::RGBA_ASTC_10x8:
    case QOpenGLTexture::RGBA_ASTC_10x10:
    case QOpenGLTexture::RGBA_ASTC_12x10:
    case QOpenGLTexture::RGBA_ASTC_12x12:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_4x4:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_5x4:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_5x5:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_6x5:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_6x6:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_8x5:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_8x6:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_8x8:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_10x5:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_10x6:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_10x8:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_10x10:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_12x10:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_12x12:
        return true;

    case QOpenGLTexture::DepthFormat:
    case QOpenGLTexture::AlphaFormat:
    case QOpenGLTexture::RGBFormat:
    case QOpenGLTexture::RGBAFormat:
    case QOpenGLTexture::LuminanceFormat:
    case QOpenGLTexture::LuminanceAlphaFormat:
        return false;
    }

    Q_UNREACHABLE_RETURN(false);
}